

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::to_composite_constructor_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *parent_type,uint32_t id,
          bool block_like_type)

{
  SPIRType *parent_type_00;
  bool bVar1;
  char (*in_R9) [2];
  byte local_21a;
  byte local_219;
  bool local_1f9;
  spirv_cross local_1f8 [32];
  string local_1d8;
  undefined1 local_1b8 [8];
  SPIRType tmp_type;
  string local_58;
  bool local_32;
  byte local_31;
  bool remapped_boolean;
  SPIRType *pSStack_30;
  bool reroll_array;
  SPIRType *type;
  bool block_like_type_local;
  SPIRType *pSStack_20;
  uint32_t id_local;
  SPIRType *parent_type_local;
  CompilerGLSL *this_local;
  string *expr;
  
  type._3_1_ = block_like_type;
  type._4_4_ = id;
  pSStack_20 = parent_type;
  parent_type_local = (SPIRType *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  pSStack_30 = Compiler::expression_type(&this->super_Compiler,id);
  local_31 = 0;
  local_1f9 = false;
  if ((pSStack_20->basetype == Struct) && (local_1f9 = false, pSStack_30->basetype == Boolean)) {
    local_1f9 = (this->backend).boolean_in_struct_remapped_type != Boolean;
  }
  local_32 = local_1f9;
  bVar1 = Compiler::is_array(&this->super_Compiler,pSStack_30);
  parent_type_00 = pSStack_20;
  if (bVar1) {
    local_219 = 1;
    if (((this->backend).array_is_value_type & 1U) != 0) {
      local_21a = 0;
      if ((type._3_1_ & 1) != 0) {
        local_21a = (this->backend).array_is_value_type_in_buffer_blocks ^ 0xff;
      }
      local_219 = local_21a;
    }
    local_31 = local_219 & 1;
    if ((local_32 & 1U) != 0) {
      local_31 = 1;
    }
  }
  if ((local_31 & 1) == 0) {
    tmp_type.member_name_cache._M_h._M_single_bucket._3_1_ = 0;
    to_unpacked_expression_abi_cxx11_(__return_storage_ptr__,this,type._4_4_,true);
    if ((local_32 & 1U) != 0) {
      SPIRType::SPIRType((SPIRType *)local_1b8,pSStack_30);
      tmp_type.super_IVariant.self.id = (this->backend).boolean_in_struct_remapped_type;
      (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1f8,this,local_1b8,0);
      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (&local_1d8,local_1f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a488c,
                 (char (*) [2])__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b01ae,in_R9
                );
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1d8);
      ::std::__cxx11::string::~string((string *)&local_1d8);
      ::std::__cxx11::string::~string((string *)local_1f8);
      SPIRType::~SPIRType((SPIRType *)local_1b8);
    }
  }
  else {
    to_enclosed_expression_abi_cxx11_(&local_58,this,type._4_4_,true);
    to_rerolled_array_expression(__return_storage_ptr__,this,parent_type_00,&local_58,pSStack_30);
    ::std::__cxx11::string::~string((string *)&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_composite_constructor_expression(const SPIRType &parent_type, uint32_t id, bool block_like_type)
{
	auto &type = expression_type(id);

	bool reroll_array = false;
	bool remapped_boolean = parent_type.basetype == SPIRType::Struct &&
	                        type.basetype == SPIRType::Boolean &&
	                        backend.boolean_in_struct_remapped_type != SPIRType::Boolean;

	if (is_array(type))
	{
		reroll_array = !backend.array_is_value_type ||
		               (block_like_type && !backend.array_is_value_type_in_buffer_blocks);

		if (remapped_boolean)
		{
			// Forced to reroll if we have to change bool[] to short[].
			reroll_array = true;
		}
	}

	if (reroll_array)
	{
		// For this case, we need to "re-roll" an array initializer from a temporary.
		// We cannot simply pass the array directly, since it decays to a pointer and it cannot
		// participate in a struct initializer. E.g.
		// float arr[2] = { 1.0, 2.0 };
		// Foo foo = { arr }; must be transformed to
		// Foo foo = { { arr[0], arr[1] } };
		// The array sizes cannot be deduced from specialization constants since we cannot use any loops.

		// We're only triggering one read of the array expression, but this is fine since arrays have to be declared
		// as temporaries anyways.
		return to_rerolled_array_expression(parent_type, to_enclosed_expression(id), type);
	}
	else
	{
		auto expr = to_unpacked_expression(id);
		if (remapped_boolean)
		{
			auto tmp_type = type;
			tmp_type.basetype = backend.boolean_in_struct_remapped_type;
			expr = join(type_to_glsl(tmp_type), "(", expr, ")");
		}

		return expr;
	}
}